

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddUnate.c
# Opt level: O2

void Extra_UnateInfoPrint(Extra_UnateInfo_t *p)

{
  int iVar1;
  Extra_UnateVar_t EVar2;
  char cVar3;
  char *__s;
  long lVar4;
  size_t __n;
  
  __n = (size_t)p->nVarsMax;
  __s = (char *)malloc(__n + 1);
  memset(__s,0x20,__n);
  __s[__n] = '\0';
  iVar1 = p->nVars;
  for (lVar4 = 0; lVar4 < iVar1; lVar4 = lVar4 + 1) {
    EVar2 = p->pVars[lVar4];
    cVar3 = '.';
    if (0x3fffffff < (uint)EVar2) {
      cVar3 = 'p';
    }
    if ((int)EVar2 < 0) {
      cVar3 = 'n';
    }
    __s[(uint)EVar2 & 0x3fffffff] = cVar3;
  }
  puts(__s);
  free(__s);
  return;
}

Assistant:

void Extra_UnateInfoPrint( Extra_UnateInfo_t * p )
{
    char * pBuffer;
    int i;
    pBuffer = ABC_ALLOC( char, p->nVarsMax+1 );
    memset( pBuffer, ' ', (size_t)p->nVarsMax );
    pBuffer[p->nVarsMax] = 0;
    for ( i = 0; i < p->nVars; i++ )
        if ( p->pVars[i].Neg )
            pBuffer[ p->pVars[i].iVar ] = 'n';
        else if ( p->pVars[i].Pos )
            pBuffer[ p->pVars[i].iVar ] = 'p';
        else
            pBuffer[ p->pVars[i].iVar ] = '.';
    printf( "%s\n", pBuffer );
    ABC_FREE( pBuffer );
}